

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::OP_NewScObject_A_Impl
          (InterpreterStackFrame *this,OpLayoutAuxiliary *playout,RegSlot *target)

{
  Var pvVar1;
  Var pvVar2;
  code *pcVar3;
  bool bVar4;
  VarArrayVarCount *pVVar5;
  undefined4 *puVar6;
  long lVar7;
  char *message;
  char *error;
  uint lineNumber;
  ulong uVar8;
  
  pVVar5 = ByteCodeReader::ReadVarArrayVarCount
                     ((playout->super_OpLayoutAuxNoReg).Offset,*(FunctionBody **)(this + 0x88));
  pvVar1 = pVVar5->count;
  if (((ulong)pvVar1 & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)pvVar1 & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)pvVar1 & 0xffff000000000000) == 0x1000000000000) goto LAB_00a485ff;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    error = "(Is(aValue))";
    message = "Ensure var is actually a \'TaggedInt\'";
    lineNumber = 0x43;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
  }
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                              ,lineNumber,error,message);
  if (!bVar4) {
LAB_00a48705:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar6 = 0;
LAB_00a485ff:
  if (0 < (int)(uint)pvVar1) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar8 = 1;
    do {
      pvVar2 = pVVar5[uVar8].count;
      lVar7 = *(long *)(this + 0x28);
      if (*(ulong *)(this + 0x30) <= lVar7 + (uVar8 & 0xffff) * 8) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x93a,"(m_outParams + outRegisterID < m_outSp)",
                                    "m_outParams + outRegisterID < m_outSp");
        if (!bVar4) goto LAB_00a48705;
        *puVar6 = 0;
        lVar7 = *(long *)(this + 0x28);
      }
      *(Var *)(lVar7 + (uVar8 & 0xffff) * 8) = pvVar2;
      bVar4 = uVar8 != ((uint)pvVar1 & 0x7fffffff);
      uVar8 = uVar8 + 1;
    } while (bVar4);
  }
  ValidateRegValue(this,*(Var *)(this + (ulong)(uint)(playout->super_OpLayoutAuxNoReg).C1 * 8 +
                                        0x160),false,true);
}

Assistant:

void InterpreterStackFrame::OP_NewScObject_A_Impl(const unaligned OpLayoutAuxiliary * playout, RegSlot *target)
    {
        const Js::VarArrayVarCount * vars = Js::ByteCodeReader::ReadVarArrayVarCount(playout->Offset, this->GetFunctionBody());

        int count = Js::TaggedInt::ToInt32(vars->count);

        // Push the parameters to stack
        for (int i = 0; i < count; i++)
        {
            SetOut((ArgSlot)(i + 1), vars->elements[i]);
        }

        Var newVarInstance = NewScObject_Helper(GetReg((RegSlot)playout->C1), (ArgSlot)count + 1);
        SetReg((RegSlot)playout->R0, newVarInstance);

    }